

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex_match.h
# Opt level: O0

value_type * __thiscall
booster::match_results<const_char_*>::suffix(match_results<const_char_*> *this)

{
  bool bVar1;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *in_RSI;
  sub_match<const_char_*> *in_RDI;
  char **unaff_retaddr;
  sub_match<const_char_*> *this_00;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *pvVar2;
  int __n;
  
  this_00 = in_RDI;
  pvVar2 = in_RSI;
  sub_match<const_char_*>::sub_match(in_RDI);
  __n = (int)((ulong)pvVar2 >> 0x20);
  bVar1 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::empty(in_RSI);
  if (!bVar1) {
    (this_00->super_pair<const_char_*,_const_char_*>).first =
         (char *)(in_RSI->
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                 _M_impl.super__Vector_impl_data._M_start;
    (this_00->super_pair<const_char_*,_const_char_*>).second =
         (char *)(in_RSI->
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::back
              ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)this_00);
    std::advance<char_const*,int>(unaff_retaddr,__n);
    this_00->matched =
         (this_00->super_pair<const_char_*,_const_char_*>).first !=
         (this_00->super_pair<const_char_*,_const_char_*>).second;
  }
  return in_RDI;
}

Assistant:

value_type suffix()
		{
			value_type r;
			if(offsets_.empty())
				return r;
			r.first = begin_;
			r.second = end_;
			std::advance(r.first,offsets_.back().second);
			r.matched = r.first != r.second;
			return r;
		}